

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_case.cc
# Opt level: O2

void __thiscall CaseField::GenInitCode(CaseField *this,Output *out_cc,Env *env)

{
  (*(((this->super_Field).type_)->super_DataDepElement)._vptr_DataDepElement[6])();
  return;
}

Assistant:

void CaseField::GenInitCode(Output* out_cc, Env* env)
	{
	// GenCaseStr(index_, out_cc, env);
	// out_cc->inc_indent();
	// out_cc->println("{");
	// out_cc->println("// Initialize \"%s\"", id_->Name());
	type_->GenInitCode(out_cc, env);
	// out_cc->println("}");
	// out_cc->println("break;");
	// out_cc->dec_indent();
	}